

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat_test.cc
# Opt level: O1

void leveldb::_Test_InternalKeyShortSeparator::_RunIt(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string sStack_2b0;
  string sStack_290;
  string sStack_270;
  string sStack_250;
  string sStack_230;
  string sStack_210;
  string sStack_1f0;
  Tester TStack_1d0;
  
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x4d;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  paVar2 = &sStack_210.field_2;
  sStack_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_210,"foo","");
  IKey(&sStack_270,&sStack_210,100,kTypeValue);
  paVar3 = &sStack_230.field_2;
  sStack_230._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_230,"foo","");
  IKey(&sStack_290,&sStack_230,100,kTypeValue);
  paVar1 = &sStack_250.field_2;
  sStack_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_250,"foo","");
  IKey(&sStack_2b0,&sStack_250,99,kTypeValue);
  Shorten(&sStack_1f0,&sStack_290,&sStack_2b0);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  paVar4 = &sStack_1f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar4) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2b0._M_dataplus._M_p != &sStack_2b0.field_2) {
    operator_delete(sStack_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_250._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_230._M_dataplus._M_p != paVar3) {
    operator_delete(sStack_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_210._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_210._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x50;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  sStack_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_210,"foo","");
  IKey(&sStack_270,&sStack_210,100,kTypeValue);
  sStack_230._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_230,"foo","");
  IKey(&sStack_290,&sStack_230,100,kTypeValue);
  sStack_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_250,"foo","");
  IKey(&sStack_2b0,&sStack_250,0x65,kTypeValue);
  Shorten(&sStack_1f0,&sStack_290,&sStack_2b0);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar4) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2b0._M_dataplus._M_p != &sStack_2b0.field_2) {
    operator_delete(sStack_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_250._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_230._M_dataplus._M_p != paVar3) {
    operator_delete(sStack_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_210._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_210._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x53;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  sStack_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_210,"foo","");
  IKey(&sStack_270,&sStack_210,100,kTypeValue);
  sStack_230._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_230,"foo","");
  IKey(&sStack_290,&sStack_230,100,kTypeValue);
  sStack_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_250,"foo","");
  IKey(&sStack_2b0,&sStack_250,100,kTypeValue);
  Shorten(&sStack_1f0,&sStack_290,&sStack_2b0);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar4) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2b0._M_dataplus._M_p != &sStack_2b0.field_2) {
    operator_delete(sStack_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_250._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_230._M_dataplus._M_p != paVar3) {
    operator_delete(sStack_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_210._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_210._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x56;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  sStack_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_210,"foo","");
  IKey(&sStack_270,&sStack_210,100,kTypeValue);
  sStack_230._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_230,"foo","");
  IKey(&sStack_290,&sStack_230,100,kTypeValue);
  sStack_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_250,"foo","");
  IKey(&sStack_2b0,&sStack_250,100,kTypeDeletion);
  Shorten(&sStack_1f0,&sStack_290,&sStack_2b0);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar4) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2b0._M_dataplus._M_p != &sStack_2b0.field_2) {
    operator_delete(sStack_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_250._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_230._M_dataplus._M_p != paVar3) {
    operator_delete(sStack_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_210._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_210._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x5a;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  sStack_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_210,"foo","");
  IKey(&sStack_270,&sStack_210,100,kTypeValue);
  sStack_230._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_230,"foo","");
  IKey(&sStack_290,&sStack_230,100,kTypeValue);
  sStack_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_250,"bar","");
  IKey(&sStack_2b0,&sStack_250,99,kTypeValue);
  Shorten(&sStack_1f0,&sStack_290,&sStack_2b0);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar4) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2b0._M_dataplus._M_p != &sStack_2b0.field_2) {
    operator_delete(sStack_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_250._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_230._M_dataplus._M_p != paVar3) {
    operator_delete(sStack_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_210._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_210._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x5f;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  sStack_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_210,"g","");
  IKey(&sStack_270,&sStack_210,0xffffffffffffff,kTypeValue);
  sStack_230._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_230,"foo","");
  IKey(&sStack_290,&sStack_230,100,kTypeValue);
  sStack_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_250,"hello","");
  IKey(&sStack_2b0,&sStack_250,200,kTypeValue);
  Shorten(&sStack_1f0,&sStack_290,&sStack_2b0);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar4) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2b0._M_dataplus._M_p != &sStack_2b0.field_2) {
    operator_delete(sStack_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_250._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_230._M_dataplus._M_p != paVar3) {
    operator_delete(sStack_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_210._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_210._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 100;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  sStack_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_210,"foo","");
  IKey(&sStack_270,&sStack_210,100,kTypeValue);
  sStack_230._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_230,"foo","");
  IKey(&sStack_290,&sStack_230,100,kTypeValue);
  sStack_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_250,"foobar","");
  IKey(&sStack_2b0,&sStack_250,200,kTypeValue);
  Shorten(&sStack_1f0,&sStack_290,&sStack_2b0);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar4) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2b0._M_dataplus._M_p != &sStack_2b0.field_2) {
    operator_delete(sStack_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_250._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_230._M_dataplus._M_p != paVar3) {
    operator_delete(sStack_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_210._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_210._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1d0);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat_test.cc"
  ;
  TStack_1d0.line_ = 0x69;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  sStack_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_210,"foobar","");
  IKey(&sStack_270,&sStack_210,100,kTypeValue);
  sStack_230._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_230,"foobar","");
  IKey(&sStack_290,&sStack_230,100,kTypeValue);
  sStack_250._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_250,"foo","");
  IKey(&sStack_2b0,&sStack_250,200,kTypeValue);
  Shorten(&sStack_1f0,&sStack_290,&sStack_2b0);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&TStack_1d0,&sStack_270,&sStack_1f0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1f0._M_dataplus._M_p != paVar4) {
    operator_delete(sStack_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2b0._M_dataplus._M_p != &sStack_2b0.field_2) {
    operator_delete(sStack_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_250._M_dataplus._M_p != paVar1) {
    operator_delete(sStack_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_290._M_dataplus._M_p != &sStack_290.field_2) {
    operator_delete(sStack_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_230._M_dataplus._M_p != paVar3) {
    operator_delete(sStack_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_270._M_dataplus._M_p != &sStack_270.field_2) {
    operator_delete(sStack_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_210._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_210._M_dataplus._M_p);
  }
  test::Tester::~Tester(&TStack_1d0);
  return;
}

Assistant:

TEST(FormatTest, InternalKeyShortSeparator) {
  // When user keys are same
  ASSERT_EQ(IKey("foo", 100, kTypeValue),
            Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 99, kTypeValue)));
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 101, kTypeValue)));
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 100, kTypeValue)));
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foo", 100, kTypeDeletion)));

  // When user keys are misordered
  ASSERT_EQ(IKey("foo", 100, kTypeValue),
            Shorten(IKey("foo", 100, kTypeValue), IKey("bar", 99, kTypeValue)));

  // When user keys are different, but correctly ordered
  ASSERT_EQ(
      IKey("g", kMaxSequenceNumber, kValueTypeForSeek),
      Shorten(IKey("foo", 100, kTypeValue), IKey("hello", 200, kTypeValue)));

  // When start user key is prefix of limit user key
  ASSERT_EQ(
      IKey("foo", 100, kTypeValue),
      Shorten(IKey("foo", 100, kTypeValue), IKey("foobar", 200, kTypeValue)));

  // When limit user key is prefix of start user key
  ASSERT_EQ(
      IKey("foobar", 100, kTypeValue),
      Shorten(IKey("foobar", 100, kTypeValue), IKey("foo", 200, kTypeValue)));
}